

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O3

FileHandleT __thiscall cmQtAutoMocUic::ParseCacheT::Get(ParseCacheT *this,string *fileName)

{
  size_type sVar1;
  const_iterator cVar2;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  FileHandleT FVar3;
  
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)fileName,in_RDX);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    (this->Map_)._M_h._M_buckets = (__buckets_ptr)0x0;
    (this->Map_)._M_h._M_bucket_count = 0;
  }
  else {
    (this->Map_)._M_h._M_buckets =
         *(__buckets_ptr *)
          ((long)cVar2.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT>_>,_true>
                 ._M_cur + 0x28);
    sVar1 = *(size_type *)
             ((long)cVar2.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT>_>,_true>
                    ._M_cur + 0x30);
    (this->Map_)._M_h._M_bucket_count = sVar1;
    if (sVar1 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(sVar1 + 8) = *(int *)(sVar1 + 8) + 1;
      }
    }
  }
  FVar3.super___shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  FVar3.super___shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (FileHandleT)
         FVar3.super___shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmQtAutoMocUic::ParseCacheT::FileHandleT cmQtAutoMocUic::ParseCacheT::Get(
  std::string const& fileName) const
{
  auto it = Map_.find(fileName);
  if (it != Map_.end()) {
    return it->second;
  }
  return FileHandleT();
}